

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O3

void __thiscall
gl4cts::StencilTexturing::FunctionalTest::prepareSourceTextureData
          (FunctionalTest *this,GLenum internal_format,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *texture_data)

{
  pointer puVar1;
  bool bVar2;
  TestError *this_00;
  char cVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  GLuint x;
  long lVar7;
  uchar uVar8;
  long lVar9;
  uint uVar10;
  float fVar11;
  
  if (internal_format == 0x88f0) {
    uVar10 = 4;
    bVar2 = true;
  }
  else {
    if (internal_format != 0x8cad) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                 ,0x403);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    uVar10 = 8;
    bVar2 = false;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (texture_data,(ulong)(uVar10 << 6));
  cVar3 = '\x01';
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar7 = 0;
    lVar6 = lVar4;
    do {
      fVar11 = ((float)(int)lVar7 * -0.071428575 + 1.0) - (float)(int)lVar5 * 0.071428575;
      puVar1 = (texture_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = cVar3 + (char)lVar7;
      if (bVar2) {
        lVar9 = (long)(fVar11 * 16777215.0);
        puVar1[lVar6] = uVar8;
        *(short *)(puVar1 + lVar6 + 1) = (short)lVar9;
        puVar1[lVar6 + 3] = (uchar)((ulong)lVar9 >> 0x10);
      }
      else {
        *(float *)(puVar1 + lVar6) = fVar11;
        puVar1[lVar6 + 4] = uVar8;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + (ulong)uVar10;
    } while (lVar7 != 8);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + (ulong)(uVar10 << 3);
    cVar3 = cVar3 + '\x01';
  } while (lVar5 != 8);
  return;
}

Assistant:

void FunctionalTest::prepareSourceTextureData(GLenum internal_format, std::vector<GLubyte>& texture_data)
{
	static const GLfloat depth_step_h   = -0.5f / ((GLfloat)(m_width - 1));
	static const GLfloat depth_step_v   = -0.5f / ((GLfloat)(m_height - 1));
	static const GLuint  stencil_step_h = 1;
	static const GLuint  stencil_step_v = 1;
	static const GLuint  n_pixels		= m_width * m_height;
	GLuint				 pixel_size		= 0;
	GLuint				 line_size		= 0;
	GLuint				 texture_size   = 0;

	/* Select size of pixel */
	switch (internal_format)
	{
	case GL_DEPTH24_STENCIL8:
		pixel_size = 4;
		break;
	case GL_DEPTH32F_STENCIL8:
		pixel_size = 8;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	line_size	= pixel_size * m_width;
	texture_size = pixel_size * n_pixels;

	/* Allocate storage */
	texture_data.resize(texture_size);

	/* Fill texture data */
	for (GLuint y = 0; y < m_height; ++y)
	{
		const GLfloat depth_v	 = depth_step_v * (GLfloat)y;
		const GLuint  line_offset = line_size * y;
		const GLuint  stencil_v   = stencil_step_v * y;

		for (GLuint x = 0; x < m_width; ++x)
		{
			const GLfloat depth_h	  = depth_step_h * (GLfloat)x;
			const GLfloat depth_f	  = 1 + depth_h + depth_v;
			const GLuint  depth_i	  = (GLuint)(((GLfloat)0xffffff) * depth_f);
			const GLuint  pixel_offset = pixel_size * x;
			const GLuint  stencil_h	= stencil_step_h * x;
			const GLuint  stencil	  = 1 + stencil_h + stencil_v;

			GLubyte* depth_f_data = (GLubyte*)&depth_f;
			GLubyte* depth_i_data = (GLubyte*)&depth_i;
			GLubyte* pixel_data   = &texture_data[0] + line_offset + pixel_offset;
			GLubyte* stencil_data = (GLubyte*)&stencil;

			switch (pixel_size)
			{
			case 4:
				memcpy(pixel_data, stencil_data, 1);
				memcpy(pixel_data + 1, depth_i_data, 3);
				break;
			case 8:
				memcpy(pixel_data, depth_f_data, 4);
				memcpy(pixel_data + 4, stencil_data, 1);
				break;
			default:
				TCU_FAIL("Invalid value");
				break;
			}
		}
	}
}